

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::PrimitiveFieldGenerator::SetExtraRuntimeHasBitsBase
          (PrimitiveFieldGenerator *this,int has_base)

{
  ObjectiveCType OVar1;
  mapped_type *pmVar2;
  int i;
  allocator<char> local_91;
  key_type local_90;
  allocator<char> local_59;
  key_type local_58;
  string local_38;
  uint local_14;
  PrimitiveFieldGenerator *pPStack_10;
  int has_base_local;
  PrimitiveFieldGenerator *this_local;
  
  local_14 = has_base;
  pPStack_10 = this;
  OVar1 = GetObjectiveCType((this->super_SingleFieldGenerator).super_FieldGenerator.descriptor_);
  if (OVar1 == OBJECTIVECTYPE_BOOLEAN) {
    SimpleItoa_abi_cxx11_(&local_38,(protobuf *)(ulong)local_14,i);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"storage_offset_value",&local_59);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(this->super_SingleFieldGenerator).super_FieldGenerator.variables_,
                          &local_58);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"storage_offset_comment",&local_91);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(this->super_SingleFieldGenerator).super_FieldGenerator.variables_,
                          &local_90);
    std::__cxx11::string::operator=((string *)pmVar2,"  // Stored in _has_storage_ to save space.");
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  return;
}

Assistant:

void PrimitiveFieldGenerator::SetExtraRuntimeHasBitsBase(int has_base) {
  if (GetObjectiveCType(descriptor_) == OBJECTIVECTYPE_BOOLEAN) {
    // Set into the offset the has bit to use for the actual value.
    variables_["storage_offset_value"] = SimpleItoa(has_base);
    variables_["storage_offset_comment"] =
        "  // Stored in _has_storage_ to save space.";
  }
}